

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20poly1305.cpp
# Opt level: O0

void anon_unknown.dwarf_1ec2f07::ComputeTag
               (ChaCha20 *chacha20,Span<const_std::byte> aad,Span<const_std::byte> cipher,
               Span<std::byte> tag)

{
  long lVar1;
  Span<const_std::byte> key;
  Span<const_std::byte> msg;
  Span<const_std::byte> msg_00;
  Span<const_std::byte> msg_01;
  Span<const_std::byte> msg_02;
  Span<const_std::byte> msg_03;
  Span<std::byte> out;
  Span<std::byte> out_00;
  Poly1305 *this;
  size_t in_RDI;
  long in_FS_OFFSET;
  uint cipher_padding_length;
  uint aad_padding_length;
  byte length_desc [16];
  Poly1305 poly1305;
  byte first_block [64];
  Span<const_std::byte> *in_stack_fffffffffffffdd8;
  uchar *in_stack_fffffffffffffde0;
  Span<const_std::byte> *in_stack_fffffffffffffde8;
  byte *pbVar2;
  ChaCha20 *in_stack_fffffffffffffe48;
  byte *in_stack_fffffffffffffe90;
  size_t in_stack_fffffffffffffe98;
  
  pbVar2 = &stack0x00000008;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Span<std::byte>::Span<64>((Span<std::byte> *)in_stack_fffffffffffffdd8,(byte (*) [64])0x103d824);
  out_00.m_size = in_stack_fffffffffffffe98;
  out_00.m_data = in_stack_fffffffffffffe90;
  ChaCha20::Keystream(in_stack_fffffffffffffe48,out_00);
  Span<std::byte>::Span<64>((Span<std::byte> *)in_stack_fffffffffffffdd8,(byte (*) [64])0x103d855);
  Span<std::byte>::first
            ((Span<std::byte> *)in_stack_fffffffffffffde8,(size_t)in_stack_fffffffffffffde0);
  Span<const_std::byte>::Span<std::byte,_0>(in_stack_fffffffffffffdd8,(Span<std::byte> *)0x103d889);
  key.m_size = in_RDI;
  key.m_data = pbVar2;
  Poly1305::Poly1305((Poly1305 *)in_stack_fffffffffffffde8,key);
  Span<const_std::byte>::size(in_stack_fffffffffffffdd8);
  msg.m_size = in_RDI;
  msg.m_data = pbVar2;
  Poly1305::Update((Poly1305 *)in_stack_fffffffffffffde8,msg);
  Span<const_std::byte>::Span<16>(in_stack_fffffffffffffdd8,(byte (*) [16])0x103d91c);
  Span<const_std::byte>::first(in_stack_fffffffffffffde8,(size_t)in_stack_fffffffffffffde0);
  msg_00.m_size = in_RDI;
  msg_00.m_data = pbVar2;
  Poly1305::Update((Poly1305 *)in_stack_fffffffffffffde8,msg_00);
  Span<const_std::byte>::size(in_stack_fffffffffffffdd8);
  msg_01.m_size = in_RDI;
  msg_01.m_data = pbVar2;
  Poly1305::Update((Poly1305 *)in_stack_fffffffffffffde8,msg_01);
  Span<const_std::byte>::Span<16>(in_stack_fffffffffffffdd8,(byte (*) [16])0x103d9bf);
  Span<const_std::byte>::first(in_stack_fffffffffffffde8,(size_t)in_stack_fffffffffffffde0);
  msg_02.m_size = in_RDI;
  msg_02.m_data = pbVar2;
  Poly1305::Update((Poly1305 *)in_stack_fffffffffffffde8,msg_02);
  UCharCast((byte *)in_stack_fffffffffffffdd8);
  Span<const_std::byte>::size(in_stack_fffffffffffffdd8);
  WriteLE64(in_stack_fffffffffffffde0,(uint64_t)in_stack_fffffffffffffdd8);
  this = (Poly1305 *)UCharCast((byte *)in_stack_fffffffffffffdd8);
  Span<const_std::byte>::size(in_stack_fffffffffffffdd8);
  WriteLE64(in_stack_fffffffffffffde0,(uint64_t)in_stack_fffffffffffffdd8);
  Span<const_std::byte>::Span<16>(in_stack_fffffffffffffdd8,(byte (*) [16])0x103da6b);
  msg_03.m_size = in_RDI;
  msg_03.m_data = pbVar2;
  Poly1305::Update(this,msg_03);
  out.m_size = in_RDI;
  out.m_data = pbVar2;
  Poly1305::Finalize(this,out);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ComputeTag(ChaCha20& chacha20, Span<const std::byte> aad, Span<const std::byte> cipher, Span<std::byte> tag) noexcept
{
    static const std::byte PADDING[16] = {{}};

    // Get block of keystream (use a full 64 byte buffer to avoid the need for chacha20's own buffering).
    std::byte first_block[ChaCha20Aligned::BLOCKLEN];
    chacha20.Keystream(first_block);

    // Use the first 32 bytes of the first keystream block as poly1305 key.
    Poly1305 poly1305{Span{first_block}.first(Poly1305::KEYLEN)};

    // Compute tag:
    // - Process the padded AAD with Poly1305.
    const unsigned aad_padding_length = (16 - (aad.size() % 16)) % 16;
    poly1305.Update(aad).Update(Span{PADDING}.first(aad_padding_length));
    // - Process the padded ciphertext with Poly1305.
    const unsigned cipher_padding_length = (16 - (cipher.size() % 16)) % 16;
    poly1305.Update(cipher).Update(Span{PADDING}.first(cipher_padding_length));
    // - Process the AAD and plaintext length with Poly1305.
    std::byte length_desc[Poly1305::TAGLEN];
    WriteLE64(UCharCast(length_desc), aad.size());
    WriteLE64(UCharCast(length_desc + 8), cipher.size());
    poly1305.Update(length_desc);

    // Output tag.
    poly1305.Finalize(tag);
}